

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O1

bool __thiscall wasm::RemoveUnusedBrs::optimizeLoop(RemoveUnusedBrs *this,Loop *loop)

{
  Id IVar1;
  char *pcVar2;
  BranchSeeker *this_00;
  Expression **ppEVar3;
  int iVar4;
  size_t sVar5;
  Index IVar6;
  Expression *pEVar7;
  Block *pBVar8;
  Unary *pUVar9;
  Expression *pEVar10;
  Break *ifTrue;
  If *pIVar11;
  ulong uVar12;
  BranchSeeker *pBVar13;
  Expression **ppEVar14;
  byte unaff_R13B;
  bool bVar15;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  optional<wasm::Type> type__02;
  optional<wasm::Type> type__03;
  Name target;
  optional<wasm::Type> type;
  anon_class_8_1_911e227b local_1c8;
  anon_class_8_1_911e227b blockifyMerge;
  bool local_1b4;
  bool local_e5;
  size_t local_a0;
  size_t local_70;
  RemoveUnusedBrs *local_68;
  char *local_60;
  Name *local_58;
  Expression *local_50;
  If *local_48;
  ulong local_40;
  Builder local_38;
  Builder builder;
  
  pcVar2 = (loop->name).super_IString.str._M_str;
  if ((((pcVar2 == (char *)0x0) ||
       (this_00 = (BranchSeeker *)loop->body,
       *(char *)&(this_00->
                 super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                 ).
                 super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                 .replacep != '\x01')) ||
      (ppEVar3 = (this_00->
                 super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                 ).
                 super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                 .stack.fixed._M_elems[1].currp, ppEVar3 < (Expression **)0x2)) ||
     (((local_60 = *(char **)((this_00->
                              super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                              ).
                              super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                              .stack.fixed._M_elems[1].func + (long)ppEVar3 * 8 + -8),
       *local_60 != '\x04' || (*(long *)(local_60 + 0x28) != 0)) ||
      ((*(long *)(local_60 + 0x20) != 0 || (*(char **)(local_60 + 0x18) != pcVar2)))))) {
    unaff_R13B = 0;
  }
  else {
    local_58 = &loop->name;
    local_60 = local_60 + 0x10;
    uVar12 = (ulong)((int)ppEVar3 - 2);
    local_38.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
         ).super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
         super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.currModule
    ;
    local_68 = this;
    do {
      ppEVar14 = (Expression **)(uVar12 & 0xffffffff);
      ppEVar3 = (this_00->
                super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                ).
                super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                .stack.fixed._M_elems[1].currp;
      if (ppEVar3 <= ppEVar14) {
LAB_00a9542e:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      pIVar11 = *(If **)((this_00->
                         super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                         ).
                         super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                         .stack.fixed._M_elems[1].func + (long)ppEVar14 * 8);
      IVar1 = (pIVar11->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id;
      if (IVar1 == IfId) {
        pEVar10 = pIVar11->ifFalse;
        IVar6 = (Index)ppEVar3;
        iVar4 = (int)uVar12;
        if (pEVar10 == (Expression *)0x0) {
          if ((pIVar11->ifTrue->type).id == 1) {
            pBVar13 = this_00;
            pEVar10 = stealSlice(&local_38,(Block *)this_00,iVar4 + 1,IVar6);
            pIVar11->ifFalse = pEVar10;
            bVar15 = false;
            type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._8_8_ = 0;
            type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload =
                 (_Storage<wasm::Type,_true>)pBVar13;
            If::finalize(pIVar11,type_);
            type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._8_8_ = 0;
            type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload =
                 (_Storage<wasm::Type,_true>)pBVar13;
            Block::finalize((Block *)this_00,type__00,Unknown);
            unaff_R13B = 1;
            goto LAB_00a9524b;
          }
        }
        else if ((pIVar11->condition->type).id != 1) {
          if (1 < (pIVar11->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type
                  .id) {
            __assert_fail("!iff->type.isConcrete()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                          ,0x279,"bool wasm::RemoveUnusedBrs::optimizeLoop(Loop *)");
          }
          pEVar7 = pIVar11->ifTrue;
          local_1c8.builder = &local_38;
          if ((pEVar7->type).id == 1) {
            local_40 = uVar12;
            pEVar7 = stealSlice(&local_38,(Block *)this_00,iVar4 + 1,IVar6);
            pBVar8 = optimizeLoop::anon_class_8_1_911e227b::operator()
                               (&stack0xfffffffffffffe38,pEVar10,pEVar7);
            pIVar11->ifFalse = (Expression *)pBVar8;
            pEVar7 = pEVar10;
LAB_00a95215:
            bVar15 = false;
            type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._8_8_ = 0;
            type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pEVar7
            ;
            If::finalize(pIVar11,type__01);
            type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._8_8_ = 0;
            type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pEVar7
            ;
            Block::finalize((Block *)this_00,type__02,Unknown);
            unaff_R13B = 1;
            uVar12 = local_40;
          }
          else {
            bVar15 = true;
            if ((pEVar10->type).id == 1) {
              local_40 = uVar12;
              pEVar10 = stealSlice(&local_38,(Block *)this_00,iVar4 + 1,IVar6);
              pBVar8 = optimizeLoop::anon_class_8_1_911e227b::operator()
                                 (&stack0xfffffffffffffe38,pEVar7,pEVar10);
              pIVar11->ifTrue = (Expression *)pBVar8;
              goto LAB_00a95215;
            }
          }
          if (!bVar15) {
LAB_00a95369:
            bVar15 = false;
            goto LAB_00a9524b;
          }
        }
LAB_00a95245:
        bVar15 = false;
        unaff_R13B = 0;
      }
      else {
        bVar15 = IVar1 != BreakId;
        if (!bVar15) {
          pEVar10 = *(Expression **)
                     &pIVar11[1].super_SpecificExpression<(wasm::Expression::Id)2>.super_Expression;
          if (((pEVar10 != (Expression *)0x0) && (pIVar11->ifFalse == (Expression *)0x0)) &&
             (pIVar11->ifTrue != (Expression *)(loop->name).super_IString.str._M_str)) {
            target.super_IString.str._M_str = (Expression **)((long)ppEVar3 + -2);
            if (target.super_IString.str._M_str == ppEVar14) {
              pUVar9 = Builder::makeUnary(&local_38,EqZInt32,pEVar10);
              *(Unary **)
               &pIVar11[1].super_SpecificExpression<(wasm::Expression::Id)2>.super_Expression =
                   pUVar9;
              pEVar10 = pIVar11->ifTrue;
              *(Expression **)local_60 = pIVar11->condition;
              *(Expression **)(local_60 + 8) = pEVar10;
              pEVar10 = (Expression *)(local_58->super_IString).str._M_str;
              pIVar11->condition = (Expression *)(local_58->super_IString).str._M_len;
              pIVar11->ifTrue = pEVar10;
              unaff_R13B = 1;
              goto LAB_00a95369;
            }
            if (pIVar11->ifTrue ==
                (Expression *)
                (this_00->
                super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                ).
                super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                .stack.fixed._M_elems[0].currp) {
              target.super_IString.str._M_len =
                   (size_t)(this_00->
                           super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                           ).
                           super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                           .stack.fixed._M_elems[0].currp;
              local_48 = pIVar11;
              local_40 = uVar12;
              IVar6 = BranchUtils::BranchSeeker::count
                                (this_00,(Expression *)
                                         (this_00->
                                         super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                         ).
                                         super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                         .stack.fixed._M_elems[0].func,target);
              if (IVar6 == 1) {
                local_50 = *(Expression **)
                            &local_48[1].super_SpecificExpression<(wasm::Expression::Id)2>.
                             super_Expression;
                uVar12 = 0;
                ifTrue = Builder::makeBreak(&local_38,(IString)*(IString *)&local_48->condition,
                                            (Expression *)0x0,(Expression *)0x0);
                pEVar7 = stealSlice(&local_38,(Block *)this_00,(int)local_40 + 1,
                                    *(Index *)&(this_00->
                                               super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                               ).
                                               super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                               .stack.fixed._M_elems[1].currp);
                type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._8_8_ = 0;
                type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._M_payload =
                     (_Storage<wasm::Type,_true>)uVar12;
                pEVar10 = local_50;
                pIVar11 = Builder::makeIf(&local_38,local_50,(Expression *)ifTrue,pEVar7,type);
                if ((this_00->
                    super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                    ).
                    super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                    .stack.fixed._M_elems[1].currp <= ppEVar14) goto LAB_00a9542e;
                *(If **)((this_00->
                         super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                         ).
                         super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                         .stack.fixed._M_elems[1].func + (long)ppEVar14 * 8) = pIVar11;
                type__03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._8_8_ = 0;
                type__03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Type>._M_payload =
                     (_Storage<wasm::Type,_true>)pEVar10;
                Block::finalize((Block *)this_00,type__03,Unknown);
                unaff_R13B = 1;
              }
              else {
                unaff_R13B = 0;
              }
              bVar15 = false;
              uVar12 = local_40;
              pIVar11 = local_48;
              goto LAB_00a9524b;
            }
          }
          goto LAB_00a95245;
        }
      }
LAB_00a9524b:
      if (bVar15) {
        EffectAnalyzer::EffectAnalyzer
                  ((EffectAnalyzer *)&stack0xfffffffffffffe38,
                   &((local_68->
                     super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                     ).super_Pass.runner)->options,
                   (local_68->
                   super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                   ).
                   super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                   .super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                   .currModule,(Expression *)pIVar11);
        sVar5 = local_a0;
        if (((local_1b4 == false) && (local_e5 == false)) && (local_70 == 0)) {
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&stack0xffffffffffffff68);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&stack0xffffffffffffff38);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&stack0xfffffffffffffee0);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&stack0xfffffffffffffeb0);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&stack0xfffffffffffffe80);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&stack0xfffffffffffffe50);
          bVar15 = false;
          if (sVar5 == 0) {
            if ((int)uVar12 == 0) {
              uVar12 = 0;
              unaff_R13B = 0;
            }
            else {
              uVar12 = (ulong)((int)uVar12 - 1);
              bVar15 = true;
            }
            goto LAB_00a952da;
          }
        }
        else {
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&stack0xffffffffffffff68);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&stack0xffffffffffffff38);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&stack0xfffffffffffffee0);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&stack0xfffffffffffffeb0);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&stack0xfffffffffffffe80);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&stack0xfffffffffffffe50);
        }
        bVar15 = false;
        unaff_R13B = 0;
      }
      else {
        bVar15 = false;
      }
LAB_00a952da:
    } while (bVar15);
  }
  return (bool)(unaff_R13B & 1);
}

Assistant:

bool optimizeLoop(Loop* loop) {
    // if a loop ends in
    // (loop $in
    //   (block $out
    //     if (..) br $in; else br $out;
    //   )
    // )
    // then our normal opts can remove the break out since it flows directly out
    // (and later passes make the if one-armed). however, the simple analysis
    // fails on patterns like
    //     if (..) br $out;
    //     br $in;
    // which is a common way to do a while (1) loop (end it with a jump to the
    // top), so we handle that here. Specifically we want to conditionalize
    // breaks to the loop top, i.e., put them behind a condition, so that other
    // code can flow directly out and thus brs out can be removed. (even if
    // the change is to let a break somewhere else flow out, that can still be
    // helpful, as it shortens the logical loop. it is also good to generate
    // an if-else instead of an if, as it might allow an eqz to be removed
    // by flipping arms)
    if (!loop->name.is()) {
      return false;
    }
    auto* block = loop->body->dynCast<Block>();
    if (!block) {
      return false;
    }
    // does the last element break to the top of the loop?
    auto& list = block->list;
    if (list.size() <= 1) {
      return false;
    }
    auto* last = list.back()->dynCast<Break>();
    if (!last || !ExpressionAnalyzer::isSimple(last) ||
        last->name != loop->name) {
      return false;
    }
    // last is a simple break to the top of the loop. if we can conditionalize
    // it, it won't block things from flowing out and not needing breaks to do
    // so.
    Index i = list.size() - 2;
    Builder builder(*getModule());
    while (1) {
      auto* curr = list[i];
      if (auto* iff = curr->dynCast<If>()) {
        // let's try to move the code going to the top of the loop into the
        // if-else
        if (!iff->ifFalse) {
          // we need the ifTrue to break, so it cannot reach the code we want to
          // move
          if (iff->ifTrue->type == Type::unreachable) {
            iff->ifFalse = stealSlice(builder, block, i + 1, list.size());
            iff->finalize();
            block->finalize();
            return true;
          }
        } else if (iff->condition->type != Type::unreachable) {
          // This is already an if-else. If one side is a dead end, we can
          // append to the other, if there is no returned value to concern us.
          // Note that we skip ifs with unreachable conditions, as they are dead
          // code that DCE can remove, and modifying them can lead to errors
          // (one of the arms may still be concrete, in which case appending to
          // it would be invalid).

          // can't be, since in the middle of a block
          assert(!iff->type.isConcrete());

          // ensures the first node is a block, if it isn't already, and merges
          // in the second, either as a single element or, if a block, by
          // appending to the first block. this keeps the order of operations in
          // place, that is, the appended element will be executed after the
          // first node's elements
          auto blockifyMerge = [&](Expression* any,
                                   Expression* append) -> Block* {
            Block* block = nullptr;
            if (any) {
              block = any->dynCast<Block>();
            }
            // if the first isn't a block, or it's a block with a name (so we
            // might branch to the end, and so can't append to it, we might skip
            // that code!) then make a new block
            if (!block || block->name.is()) {
              block = builder.makeBlock(any);
            } else {
              assert(!block->type.isConcrete());
            }
            auto* other = append->dynCast<Block>();
            if (!other) {
              block->list.push_back(append);
            } else {
              for (auto* item : other->list) {
                block->list.push_back(item);
              }
            }
            block->finalize();
            return block;
          };

          if (iff->ifTrue->type == Type::unreachable) {
            iff->ifFalse = blockifyMerge(
              iff->ifFalse, stealSlice(builder, block, i + 1, list.size()));
            iff->finalize();
            block->finalize();
            return true;
          } else if (iff->ifFalse->type == Type::unreachable) {
            iff->ifTrue = blockifyMerge(
              iff->ifTrue, stealSlice(builder, block, i + 1, list.size()));
            iff->finalize();
            block->finalize();
            return true;
          }
        }
        return false;
      } else if (auto* brIf = curr->dynCast<Break>()) {
        // br_if is similar to if.
        if (brIf->condition && !brIf->value && brIf->name != loop->name) {
          if (i == list.size() - 2) {
            // there is the br_if, and then the br to the top, so just flip them
            // and the condition
            brIf->condition = builder.makeUnary(EqZInt32, brIf->condition);
            last->name = brIf->name;
            brIf->name = loop->name;
            return true;
          } else {
            // there are elements in the middle,
            //   br_if $somewhere (condition)
            //   (..more..)
            //   br $in
            // we can convert the br_if to an if. this has a cost, though,
            // so only do it if it looks useful, which it definitely is if
            //  (a) $somewhere is straight out (so the br out vanishes), and
            //  (b) this br_if is the only branch to that block (so the block
            //      will vanish)
            if (brIf->name == block->name &&
                BranchUtils::BranchSeeker::count(block, block->name) == 1) {
              // note that we could drop the last element here, it is a br we
              // know for sure is removable, but telling stealSlice to steal all
              // to the end is more efficient, it can just truncate.
              list[i] =
                builder.makeIf(brIf->condition,
                               builder.makeBreak(brIf->name),
                               stealSlice(builder, block, i + 1, list.size()));
              block->finalize();
              return true;
            }
          }
        }
        return false;
      }
      // if there is control flow, we must stop looking
      if (EffectAnalyzer(getPassOptions(), *getModule(), curr)
            .transfersControlFlow()) {
        return false;
      }
      if (i == 0) {
        return false;
      }
      i--;
    }
  }